

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setupRowVals(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this)

{
  int **p;
  int **p_00;
  int **p_01;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *this_00;
  int **p_02;
  uint *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  iterator __position;
  pointer pnVar8;
  int *piVar9;
  int *piVar10;
  int *piVar11;
  int *piVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  cpp_dec_float<100U,_int,_void> *pcVar20;
  int32_t iVar21;
  int *piVar22;
  int *piVar23;
  int iVar24;
  int iVar25;
  long lVar26;
  pointer pnVar27;
  long lVar28;
  cpp_dec_float<100U,_int,_void> local_80;
  
  iVar2 = (this->l).firstUpdate;
  piVar5 = (this->l).start;
  iVar24 = piVar5[iVar2];
  pnVar27 = (this->l).rval.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pnVar27 !=
      (this->l).rval.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    (this->l).rval.
    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pnVar27;
  }
  piVar6 = (this->l).row;
  pnVar27 = (this->l).val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  piVar22 = (this->l).idx;
  p = &(this->l).ridx;
  piVar7 = (this->l).ridx;
  if (piVar7 != (int *)0x0) {
    free(piVar7);
    *p = (int *)0x0;
  }
  p_00 = &(this->l).rbeg;
  piVar7 = (this->l).rbeg;
  if (piVar7 != (int *)0x0) {
    free(piVar7);
    *p_00 = (int *)0x0;
  }
  p_01 = &(this->l).rorig;
  piVar7 = (this->l).rorig;
  if (piVar7 != (int *)0x0) {
    free(piVar7);
    *p_01 = (int *)0x0;
  }
  this_00 = &(this->l).rval;
  p_02 = &(this->l).rperm;
  piVar7 = (this->l).rperm;
  if (piVar7 != (int *)0x0) {
    free(piVar7);
    *p_02 = (int *)0x0;
  }
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::reserve(this_00,(long)iVar24);
  __position._M_current =
       (this->l).rval.
       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&local_80,0,(type *)0x0);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::_M_fill_insert(this_00,__position,(long)iVar24,(value_type *)&local_80);
  spx_alloc<int*>(p,iVar24);
  spx_alloc<int*>(p_00,this->thedim + 1);
  spx_alloc<int*>(p_01,this->thedim);
  spx_alloc<int*>(p_02,this->thedim);
  piVar7 = (this->l).ridx;
  pnVar8 = (this->l).rval.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar9 = (this->l).rbeg;
  iVar25 = this->thedim;
  piVar23 = piVar9;
  if (iVar25 != 0) {
    piVar23 = (this->row).orig;
    piVar10 = (this->row).perm;
    piVar11 = (this->l).rperm;
    piVar12 = (this->l).rorig;
    lVar26 = 0;
    lVar28 = 0;
    do {
      piVar12[lVar28] = piVar23[lVar28];
      piVar11[lVar28] = piVar10[lVar28];
      piVar9[lVar28] = 0;
      lVar28 = lVar28 + 1;
      lVar26 = lVar26 + -4;
    } while (iVar25 != (int)lVar28);
    piVar23 = (int *)((long)piVar9 - lVar26);
  }
  *piVar23 = 0;
  if (iVar24 != 0) {
    lVar26 = 0;
    do {
      piVar9[(long)piVar22[lVar26] + 1] = piVar9[(long)piVar22[lVar26] + 1] + 1;
      lVar26 = lVar26 + 1;
    } while (iVar24 != (int)lVar26);
  }
  piVar22 = (this->l).idx;
  iVar24 = this->thedim;
  if (iVar24 != 0) {
    lVar26 = 0;
    iVar25 = 0;
    do {
      iVar3 = piVar9[lVar26 + 1];
      piVar9[lVar26 + 1] = iVar25;
      lVar26 = lVar26 + 1;
      iVar25 = iVar3 + iVar25;
    } while (iVar24 != (int)lVar26);
  }
  if (0 < iVar2) {
    iVar24 = 0;
    lVar26 = 0;
    do {
      lVar28 = lVar26 + 1;
      if (iVar24 < piVar5[lVar26 + 1]) {
        iVar25 = piVar6[lVar26];
        do {
          iVar3 = *piVar22;
          piVar22 = piVar22 + 1;
          iVar4 = piVar9[(long)iVar3 + 1];
          piVar9[(long)iVar3 + 1] = iVar4 + 1;
          piVar7[iVar4] = iVar25;
          uVar13 = *(undefined8 *)(pnVar27->m_backend).data._M_elems;
          uVar14 = *(undefined8 *)((long)(pnVar27->m_backend).data._M_elems + 8);
          uVar15 = *(undefined8 *)((long)(pnVar27->m_backend).data._M_elems + 0x10);
          uVar16 = *(undefined8 *)((long)(pnVar27->m_backend).data._M_elems + 0x18);
          uVar17 = *(undefined8 *)((long)(pnVar27->m_backend).data._M_elems + 0x20);
          uVar18 = *(undefined8 *)((long)(pnVar27->m_backend).data._M_elems + 0x28);
          uVar19 = *(undefined8 *)((long)(pnVar27->m_backend).data._M_elems + 0x38);
          puVar1 = (uint *)((long)pnVar8[iVar4].m_backend.data._M_elems + 0x30);
          *(undefined8 *)puVar1 = *(undefined8 *)((long)(pnVar27->m_backend).data._M_elems + 0x30);
          *(undefined8 *)(puVar1 + 2) = uVar19;
          puVar1 = (uint *)((long)pnVar8[iVar4].m_backend.data._M_elems + 0x20);
          *(undefined8 *)puVar1 = uVar17;
          *(undefined8 *)(puVar1 + 2) = uVar18;
          puVar1 = (uint *)((long)pnVar8[iVar4].m_backend.data._M_elems + 0x10);
          *(undefined8 *)puVar1 = uVar15;
          *(undefined8 *)(puVar1 + 2) = uVar16;
          *(undefined8 *)pnVar8[iVar4].m_backend.data._M_elems = uVar13;
          *(undefined8 *)((long)pnVar8[iVar4].m_backend.data._M_elems + 8) = uVar14;
          pnVar8[iVar4].m_backend.exp = (pnVar27->m_backend).exp;
          pnVar8[iVar4].m_backend.neg = (pnVar27->m_backend).neg;
          pcVar20 = &pnVar27->m_backend;
          iVar21 = (pnVar27->m_backend).prec_elem;
          pnVar27 = pnVar27 + 1;
          pnVar8[iVar4].m_backend.fpclass = pcVar20->fpclass;
          pnVar8[iVar4].m_backend.prec_elem = iVar21;
          iVar24 = iVar24 + 1;
        } while (iVar24 < piVar5[lVar28]);
      }
      lVar26 = lVar28;
    } while (lVar28 != iVar2);
  }
  return;
}

Assistant:

void CLUFactor<R>::setupRowVals()
{
   int   i, j, k, m;
   int   vecs, mem;
   int*  l_row;
   int*  idx;
   R* val;
   int*  beg;
   int*  l_ridx;
   R* l_rval;
   int*  l_rbeg;
   int*  rorig;
   int*  rrorig;
   int*  rperm;
   int*  rrperm;

   vecs  = l.firstUpdate;
   l_row = l.row;
   idx   = l.idx;
   val   = l.val.data();
   beg   = l.start;
   mem   = beg[vecs];

   if(!l.rval.empty())
   {
      l.rval.clear();
   }


   if(l.ridx)
      spx_free(l.ridx);

   if(l.rbeg)
      spx_free(l.rbeg);

   if(l.rorig)
      spx_free(l.rorig);

   if(l.rperm)
      spx_free(l.rperm);

   l.rval.reserve(mem);         // small performance improvement before the insertion
   // Insert mem number of zeros.
   l.rval.insert(l.rval.begin(), mem, 0);

   spx_alloc(l.ridx, mem);

   spx_alloc(l.rbeg, thedim + 1);

   spx_alloc(l.rorig, thedim);

   spx_alloc(l.rperm, thedim);

   l_ridx = l.ridx;

   l_rval = l.rval.data();

   l_rbeg = l.rbeg;

   rorig  = l.rorig;

   rrorig = row.orig;

   rperm  = l.rperm;

   rrperm = row.perm;

   for(i = thedim; i--; *l_rbeg++ = 0)
   {
      *rorig++ = *rrorig++;
      *rperm++ = *rrperm++;
   }

   *l_rbeg = 0;

   l_rbeg = l.rbeg + 1;

   for(i = mem; i--;)
      l_rbeg[*idx++]++;

   idx = l.idx;

   for(m = 0, i = thedim; i--; l_rbeg++)
   {
      j = *l_rbeg;
      *l_rbeg = m;
      m += j;
   }

   assert(m == mem);

   l_rbeg = l.rbeg + 1;

   for(i = j = 0; i < vecs; ++i)
   {
      m = l_row[i];
      assert(idx == &l.idx[l.start[i]]);

      for(; j < beg[i + 1]; j++)
      {
         k = l_rbeg[*idx++]++;
         assert(k < mem);
         l_ridx[k] = m;
         l_rval[k] = *val++;
      }
   }

   assert(l.rbeg[thedim] == mem);

   assert(l.rbeg[0] == 0);
}